

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

LoadResult
wallet::LoadRecords(CWallet *pwallet,DatabaseBatch *batch,string *key,DataStream *prefix,
                   LoadFunc *load_func)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_01;
  __type_conflict _Var1;
  int iVar2;
  DBErrors DVar3;
  pointer pbVar4;
  DBErrors DVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec8;
  ulong uVar7;
  long *local_120;
  DataStream local_118;
  DataStream ssKey;
  string local_d8 [32];
  string error;
  string type;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ssKey.m_read_pos = 0;
  ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.m_read_pos = 0;
  local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar4 = (prefix->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + prefix->m_read_pos;
  (*batch->_vptr_DatabaseBatch[10])
            (&local_120,batch,pbVar4,
             (long)(prefix->vch).
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pbVar4);
  if (local_120 == (long *)0x0) {
    std::__cxx11::string::string(local_58,key);
    parameters_00._M_string_length = (size_type)pwallet;
    parameters_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
    parameters_00.field_2._M_allocated_capacity = in_stack_fffffffffffffec8;
    parameters_00.field_2._8_8_ = key;
    CWallet::WalletLogPrintf<std::__cxx11::string>
              (pwallet,"Error getting database cursor for \'%s\' records\n",parameters_00);
    std::__cxx11::string::~string(local_58);
    uVar7 = 0;
  }
  else {
    DVar5 = LOAD_OK;
    uVar7 = 0;
    while( true ) {
      iVar2 = (**(code **)(*local_120 + 0x10))(local_120,&ssKey,&local_118);
      if (iVar2 == 0) break;
      if (iVar2 == 2) {
        uVar6 = (ulong)DVar5;
        goto LAB_009cc118;
      }
      type._M_dataplus._M_p = (pointer)&type.field_2;
      type._M_string_length = 0;
      type.field_2._M_local_buf[0] = '\0';
      Unserialize<DataStream,char>(&ssKey,&type);
      _Var1 = std::operator==(&type,key);
      if (!_Var1) {
        __assert_fail("type == key",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp"
                      ,0x209,
                      "LoadResult wallet::LoadRecords(CWallet *, DatabaseBatch &, const std::string &, DataStream &, LoadFunc)"
                     );
      }
      error._M_dataplus._M_p = (pointer)&error.field_2;
      error._M_string_length = 0;
      error.field_2._M_local_buf[0] = '\0';
      DVar3 = std::
              function<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(load_func,pwallet,&ssKey,&local_118,&error);
      if (DVar3 != LOAD_OK) {
        std::__cxx11::string::string(local_d8,&error);
        parameters._M_string_length = (size_type)pwallet;
        parameters._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
        parameters.field_2._M_allocated_capacity = uVar7;
        parameters.field_2._8_8_ = key;
        CWallet::WalletLogPrintf<std::__cxx11::string>(pwallet,"%s\n",parameters);
        std::__cxx11::string::~string(local_d8);
      }
      if ((int)DVar5 <= (int)DVar3) {
        DVar5 = DVar3;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::~string((string *)&type);
    }
    std::__cxx11::string::string(local_78,key);
    parameters_01._M_string_length = (size_type)pwallet;
    parameters_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8;
    parameters_01.field_2._M_allocated_capacity = uVar7;
    parameters_01.field_2._8_8_ = key;
    CWallet::WalletLogPrintf<std::__cxx11::string>
              (pwallet,"Error reading next \'%s\' record for wallet database\n",parameters_01);
    std::__cxx11::string::~string(local_78);
  }
  uVar6 = 9;
LAB_009cc118:
  if (local_120 != (long *)0x0) {
    (**(code **)(*local_120 + 8))();
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_118);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ssKey);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (LoadResult)(uVar7 << 0x20 | uVar6);
  }
  __stack_chk_fail();
}

Assistant:

static LoadResult LoadRecords(CWallet* pwallet, DatabaseBatch& batch, const std::string& key, DataStream& prefix, LoadFunc load_func)
{
    LoadResult result;
    DataStream ssKey;
    DataStream ssValue{};

    Assume(!prefix.empty());
    std::unique_ptr<DatabaseCursor> cursor = batch.GetNewPrefixCursor(prefix);
    if (!cursor) {
        pwallet->WalletLogPrintf("Error getting database cursor for '%s' records\n", key);
        result.m_result = DBErrors::CORRUPT;
        return result;
    }

    while (true) {
        DatabaseCursor::Status status = cursor->Next(ssKey, ssValue);
        if (status == DatabaseCursor::Status::DONE) {
            break;
        } else if (status == DatabaseCursor::Status::FAIL) {
            pwallet->WalletLogPrintf("Error reading next '%s' record for wallet database\n", key);
            result.m_result = DBErrors::CORRUPT;
            return result;
        }
        std::string type;
        ssKey >> type;
        assert(type == key);
        std::string error;
        DBErrors record_res = load_func(pwallet, ssKey, ssValue, error);
        if (record_res != DBErrors::LOAD_OK) {
            pwallet->WalletLogPrintf("%s\n", error);
        }
        result.m_result = std::max(result.m_result, record_res);
        ++result.m_records;
    }
    return result;
}